

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmtable.cpp
# Opt level: O0

void __thiscall icu_63::Formattable::Formattable(Formattable *this,UObject *objectToAdopt)

{
  EVP_PKEY_CTX *ctx;
  UObject *objectToAdopt_local;
  Formattable *this_local;
  
  ctx = (EVP_PKEY_CTX *)objectToAdopt;
  UObject::UObject(&this->super_UObject);
  (this->super_UObject)._vptr_UObject = (_func_int **)&PTR__Formattable_0049bb28;
  UnicodeString::UnicodeString(&this->fBogus);
  init(this,ctx);
  this->fType = kObject;
  (this->fValue).fObject = objectToAdopt;
  return;
}

Assistant:

Formattable::Formattable(UObject* objectToAdopt)
{
    init();
    fType = kObject;
    fValue.fObject = objectToAdopt;
}